

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromAsciiStlFile
          (SimplePolygonMesh *this,istream *in)

{
  undefined1 auVar1 [16];
  pointer pVVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  __type _Var14;
  string *prefix;
  string *prefix_00;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  Vector3 normal;
  Vector3 position;
  long local_220;
  string line;
  anon_class_24_3_19152d57 assertToken;
  anon_class_32_4_26ba02a2 nextLine;
  size_t lineNum;
  stringstream ss;
  
  clear(this);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  assertToken.lineNum = &lineNum;
  assertToken.line = &line;
  lineNum = 1;
  assertToken.ss = &ss;
  nextLine.in = in;
  nextLine.line = assertToken.line;
  nextLine.ss = &ss;
  nextLine.lineNum = assertToken.lineNum;
  readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&nextLine);
  while( true ) {
    bVar13 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&nextLine);
    if (!bVar13) break;
    ::std::__cxx11::string::string((string *)&position,"endsolid",(allocator *)&normal);
    _Var14 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)&line,(string *)&position,prefix);
    ::std::__cxx11::string::~string((string *)&position);
    if (_Var14) break;
    ::std::__cxx11::string::string((string *)&position,"facet",(allocator *)&normal);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&assertToken,(string *)&position)
    ;
    ::std::__cxx11::string::~string((string *)&position);
    ::std::__cxx11::string::string((string *)&position,"normal",(allocator *)&normal);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&assertToken,(string *)&position)
    ;
    ::std::__cxx11::string::~string((string *)&position);
    operator>>((istream *)&ss,&normal);
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&nextLine);
    ::std::__cxx11::string::string((string *)&position,"outer",(allocator *)&face);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&assertToken,(string *)&position)
    ;
    ::std::__cxx11::string::~string((string *)&position);
    ::std::__cxx11::string::string((string *)&position,"loop",(allocator *)&face);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&assertToken,(string *)&position)
    ;
    ::std::__cxx11::string::~string((string *)&position);
    face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      bVar13 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&nextLine);
      if (!bVar13) break;
      ::std::__cxx11::string::string((string *)&position,"endloop",(allocator *)&local_220);
      _Var14 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)&line,(string *)&position,prefix_00);
      ::std::__cxx11::string::~string((string *)&position);
      if (_Var14) break;
      ::std::__cxx11::string::string((string *)&position,"vertex",(allocator *)&local_220);
      readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()
                (&assertToken,(string *)&position);
      ::std::__cxx11::string::~string((string *)&position);
      operator>>((istream *)&ss,&position);
      ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::push_back
                ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                 &this->vertexCoordinates,(value_type *)&position);
      local_220 = ((long)(this->vertexCoordinates).
                         super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->vertexCoordinates).
                        super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18 + -1;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&face,(unsigned_long *)&local_220);
    }
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&nextLine);
    ::std::__cxx11::string::string((string *)&position,"endfacet",(allocator *)&local_220);
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&assertToken,(string *)&position)
    ;
    ::std::__cxx11::string::~string((string *)&position);
    pVVar2 = (this->vertexCoordinates).
             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    uVar4 = *face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    dVar6 = pVVar2[uVar3].y - pVVar2[uVar4].y;
    dVar7 = pVVar2[uVar3].z - pVVar2[uVar4].z;
    dVar8 = pVVar2[uVar3].x - pVVar2[uVar4].x;
    dVar9 = pVVar2[uVar5].y - pVVar2[uVar4].y;
    dVar10 = pVVar2[uVar5].z - pVVar2[uVar4].z;
    dVar11 = pVVar2[uVar5].x - pVVar2[uVar4].x;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar6;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar10;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar9 * dVar7;
    auVar12 = vfmsub231sd_fma(auVar24,auVar16,auVar22);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar11;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar7;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar10 * dVar8;
    auVar16 = vfmsub231sd_fma(auVar23,auVar18,auVar21);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar8;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar11 * dVar6;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar9;
    auVar15 = vfmsub231sd_fma(auVar17,auVar15,auVar20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = normal.x;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar16._0_8_ * normal.y;
    auVar1 = vfmadd231sd_fma(auVar19,auVar12,auVar1);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = normal.z;
    auVar1 = vfmadd231sd_fma(auVar1,auVar15,auVar12);
    if (auVar1._0_8_ < 0.0) {
      ::std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    ::std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)this,&face);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&face.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  ::std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromAsciiStlFile(std::istream& in) {
  clear();

  std::string line;
  std::stringstream ss;
  size_t lineNum = 1;

  auto assertToken = [&](const std::string& expected) {
    std::string token;
    ss >> token;
    if (token != expected) {
      std::ostringstream errorMessage;
      errorMessage << "Failed to parse ASCII stl file." << std::endl
                   << "Error on line " << lineNum << ". Expected \"" << expected << "\" but token \"" << token << "\""
                   << std::endl
                   << "Full line: \"" << line << "\"" << std::endl;
      throw std::runtime_error(errorMessage.str());
    }
  };

  auto nextLine = [&]() {
    if (!getline(in, line)) {
      return false;
    }

    ss = std::stringstream(line);
    lineNum++;
    return true;
  };

  auto startsWithToken = [](const std::string& str, const std::string& prefix) {
    std::stringstream ss(str);
    std::string token;
    ss >> token;
    return token == prefix;
  };
  // Eat the header line
  nextLine();  
  // Parse STL file
  while (nextLine() && !startsWithToken(line, "endsolid")) {
    assertToken("facet");
    assertToken("normal");

    // TODO: store this normal?
    Vector3 normal;
    ss >> normal;

    nextLine();

    assertToken("outer");
    assertToken("loop");

    std::vector<size_t> face;
    while (nextLine() && !startsWithToken(line, "endloop")) {
      assertToken("vertex");

      Vector3 position;
      ss >> position;
      vertexCoordinates.push_back(position);

      face.push_back(vertexCoordinates.size() - 1);
    }

    nextLine();
    assertToken("endfacet");

    // Orient face using normal
    Vector3 faceNormal = cross(vertexCoordinates[face[1]] - vertexCoordinates[face[0]],
                               vertexCoordinates[face[2]] - vertexCoordinates[face[0]]);
    if (dot(faceNormal, normal) < 0) {
      std::reverse(std::begin(face), std::end(face));
    }

    polygons.push_back(face);
  }
}